

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_analysis.cpp
# Opt level: O2

loop_variable * __thiscall
loop_variable_state::get_or_insert(loop_variable_state *this,ir_variable *var,bool in_assignee)

{
  loop_variable *plVar1;
  
  plVar1 = get(this,var);
  if (plVar1 == (loop_variable *)0x0) {
    plVar1 = insert(this,var);
    plVar1->read_before_write = !in_assignee;
  }
  return plVar1;
}

Assistant:

loop_variable *
loop_variable_state::get_or_insert(ir_variable *var, bool in_assignee)
{
   loop_variable *lv = this->get(var);

   if (lv == NULL) {
      lv = this->insert(var);
      lv->read_before_write = !in_assignee;
   }

   return lv;
}